

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::composeQuickCheck
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool onlyContiguous,
          UNormalizationCheckResult *pQCResult)

{
  uint16_t norm16_00;
  UChar UVar1;
  void *pvVar2;
  UChar *pUVar3;
  UBool UVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  UChar *pUVar8;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_88;
  uint16_t __c2_1;
  int32_t __index_1;
  uint8_t prevCC;
  UChar *nextSrc;
  int local_70;
  uint8_t cc;
  uint16_t __c2;
  int32_t __index;
  uint16_t n16;
  UChar *p;
  uint16_t local_56;
  uint16_t prevNorm16;
  UChar c2;
  uint16_t norm16;
  UChar32 c;
  UChar *prevSrc;
  UErrorCode errorCode;
  UChar32 minNoMaybeCP;
  UChar *prevBoundary;
  UNormalizationCheckResult *pQCResult_local;
  UChar *pUStack_28;
  UBool onlyContiguous_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  prevSrc._4_4_ = (uint)(ushort)this->minCompNoMaybeCP;
  _errorCode = src;
  prevBoundary = (UChar *)pQCResult;
  pQCResult_local._7_1_ = onlyContiguous;
  pUStack_28 = limit;
  pUVar8 = src;
  src_local = (UChar *)this;
  if (limit == (UChar *)0x0) {
    prevSrc._0_4_ = 0;
    limit_local = src;
    limit_local = copyLowPrefixFromNulTerminated
                            (this,src,prevSrc._4_4_,(ReorderingBuffer *)0x0,(UErrorCode *)&prevSrc);
    pUStack_28 = u_strchr_63(limit_local,L'\0');
    pUVar8 = limit_local;
    if ((_errorCode != limit_local) &&
       (UVar4 = hasCompBoundaryAfter(this,(uint)(ushort)limit_local[-1],pQCResult_local._7_1_),
       _errorCode = limit_local, pUVar8 = limit_local, UVar4 == '\0')) {
      _errorCode = limit_local + -1;
      pUVar8 = _errorCode;
    }
  }
LAB_001a1359:
  while( true ) {
    limit_local = pUVar8;
    if (limit_local == pUStack_28) {
      return limit_local;
    }
    uVar6 = (uint)(ushort)*limit_local;
    if ((int)prevSrc._4_4_ <= (int)uVar6) break;
LAB_001a13c1:
    pUVar8 = limit_local + 1;
  }
  local_56 = *(uint16_t *)
              ((long)(this->normTrie->data).ptr0 +
              (long)(int)((uint)this->normTrie->index[(int)uVar6 >> 6] + (uVar6 & 0x3f)) * 2);
  UVar4 = isCompYesAndZeroCC(this,local_56);
  pUVar3 = limit_local;
  if (UVar4 != '\0') goto LAB_001a13c1;
  pUVar8 = limit_local + 1;
  if ((uVar6 & 0xfffffc00) == 0xd800) goto LAB_001a13f9;
  goto LAB_001a14d2;
LAB_001a13f9:
  if ((pUVar8 != pUStack_28) && ((*pUVar8 & 0xfc00U) == 0xdc00)) {
    limit_local = limit_local + 2;
    iVar7 = uVar6 * 0x400 + (uint)(ushort)*pUVar8 + -0x35fdc00;
    pvVar2 = (this->normTrie->data).ptr0;
    if (iVar7 < this->normTrie->highStart) {
      local_a4 = ucptrie_internalSmallIndex_63(this->normTrie,iVar7);
    }
    else {
      local_a4 = this->normTrie->dataLength + -2;
    }
    local_56 = *(uint16_t *)((long)pvVar2 + (long)local_a4 * 2);
    UVar4 = isCompYesAndZeroCC(this,local_56);
    pUVar8 = limit_local;
    if (UVar4 == '\0') {
LAB_001a14d2:
      limit_local = pUVar8;
      p._6_2_ = 1;
      if (_errorCode != pUVar3) {
        UVar4 = norm16HasCompBoundaryBefore(this,local_56);
        if (UVar4 == '\0') {
          ___index = pUVar3 + -1;
          uVar6 = (uint)(ushort)pUVar3[-1];
          if ((uVar6 & 0xfffff800) == 0xd800) {
            if ((((pUVar3[-1] & 0x400U) == 0) || (___index == _errorCode)) ||
               ((pUVar3[-2] & 0xfc00U) != 0xd800)) {
              local_70 = this->normTrie->dataLength + -1;
            }
            else {
              ___index = pUVar3 + -2;
              iVar7 = (uint)(ushort)pUVar3[-2] * 0x400 + uVar6 + -0x35fdc00;
              if (iVar7 < this->normTrie->highStart) {
                local_a8 = ucptrie_internalSmallIndex_63(this->normTrie,iVar7);
              }
              else {
                local_a8 = this->normTrie->dataLength + -2;
              }
              local_70 = local_a8;
            }
          }
          else {
            local_70 = (uint)this->normTrie->index[(int)uVar6 >> 6] + (uVar6 & 0x3f);
          }
          norm16_00 = *(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_70 * 2);
          UVar4 = norm16HasCompBoundaryAfter(this,norm16_00,pQCResult_local._7_1_);
          if (UVar4 == '\0') {
            _errorCode = ___index;
            p._6_2_ = norm16_00;
          }
          else {
            _errorCode = pUVar3;
          }
        }
        else {
          _errorCode = pUVar3;
        }
      }
      UVar4 = isMaybeOrNonZeroCC(this,local_56);
      if ((UVar4 != '\0') &&
         (((nextSrc._5_1_ = getCCFromYesOrMaybe(local_56), pQCResult_local._7_1_ == '\0' ||
           (nextSrc._5_1_ == 0)) ||
          (bVar5 = getTrailCCFromCompYesAndZeroCC(this,p._6_2_), bVar5 <= nextSrc._5_1_)))) {
        while( true ) {
          if (local_56 < 0xfe02) {
            if (prevBoundary == (UChar *)0x0) {
              return _errorCode;
            }
            prevBoundary[0] = L'\x02';
            prevBoundary[1] = L'\0';
          }
          if (limit_local == pUStack_28) {
            return limit_local;
          }
          ___index_1 = limit_local + 1;
          uVar6 = (uint)(ushort)*limit_local;
          if ((uVar6 & 0xfffff800) == 0xd800) {
            if ((((*limit_local & 0x400U) == 0) && (___index_1 != pUStack_28)) &&
               (UVar1 = *___index_1, (UVar1 & 0xfc00U) == 0xdc00)) {
              ___index_1 = limit_local + 2;
              iVar7 = uVar6 * 0x400 + (uint)(ushort)UVar1 + -0x35fdc00;
              if (iVar7 < this->normTrie->highStart) {
                local_ac = ucptrie_internalSmallIndex_63(this->normTrie,iVar7);
              }
              else {
                local_ac = this->normTrie->dataLength + -2;
              }
              local_88 = local_ac;
            }
            else {
              local_88 = this->normTrie->dataLength + -1;
            }
          }
          else {
            local_88 = (uint)this->normTrie->index[(int)uVar6 >> 6] + (uVar6 & 0x3f);
          }
          local_56 = *(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_88 * 2);
          UVar4 = isMaybeOrNonZeroCC(this,local_56);
          if ((UVar4 == '\0') ||
             ((bVar5 = getCCFromYesOrMaybe(local_56), bVar5 < nextSrc._5_1_ && (bVar5 != 0))))
          break;
          limit_local = ___index_1;
          nextSrc._5_1_ = bVar5;
        }
        UVar4 = isCompYesAndZeroCC(this,local_56);
        if (UVar4 != '\0') {
          _errorCode = limit_local;
          pUVar8 = ___index_1;
          goto LAB_001a1359;
        }
      }
      if (prevBoundary != (UChar *)0x0) {
        prevBoundary[0] = L'\0';
        prevBoundary[1] = L'\0';
      }
      return _errorCode;
    }
  }
  goto LAB_001a1359;
}

Assistant:

const UChar *
Normalizer2Impl::composeQuickCheck(const UChar *src, const UChar *limit,
                                   UBool onlyContiguous,
                                   UNormalizationCheckResult *pQCResult) const {
    const UChar *prevBoundary=src;
    UChar32 minNoMaybeCP=minCompNoMaybeCP;
    if(limit==NULL) {
        UErrorCode errorCode=U_ZERO_ERROR;
        src=copyLowPrefixFromNulTerminated(src, minNoMaybeCP, NULL, errorCode);
        limit=u_strchr(src, 0);
        if (prevBoundary != src) {
            if (hasCompBoundaryAfter(*(src-1), onlyContiguous)) {
                prevBoundary = src;
            } else {
                prevBoundary = --src;
            }
        }
    }

    for(;;) {
        // Fast path: Scan over a sequence of characters below the minimum "no or maybe" code point,
        // or with (compYes && ccc==0) properties.
        const UChar *prevSrc;
        UChar32 c = 0;
        uint16_t norm16 = 0;
        for (;;) {
            if(src==limit) {
                return src;
            }
            if( (c=*src)<minNoMaybeCP ||
                isCompYesAndZeroCC(norm16=UCPTRIE_FAST_BMP_GET(normTrie, UCPTRIE_16, c))
            ) {
                ++src;
            } else {
                prevSrc = src++;
                if(!U16_IS_LEAD(c)) {
                    break;
                } else {
                    UChar c2;
                    if(src!=limit && U16_IS_TRAIL(c2=*src)) {
                        ++src;
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                        norm16=UCPTRIE_FAST_SUPP_GET(normTrie, UCPTRIE_16, c);
                        if(!isCompYesAndZeroCC(norm16)) {
                            break;
                        }
                    }
                }
            }
        }
        // isCompYesAndZeroCC(norm16) is false, that is, norm16>=minNoNo.
        // The current character is either a "noNo" (has a mapping)
        // or a "maybeYes" (combines backward)
        // or a "yesYes" with ccc!=0.
        // It is not a Hangul syllable or Jamo L because those have "yes" properties.

        uint16_t prevNorm16 = INERT;
        if (prevBoundary != prevSrc) {
            if (norm16HasCompBoundaryBefore(norm16)) {
                prevBoundary = prevSrc;
            } else {
                const UChar *p = prevSrc;
                uint16_t n16;
                UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, prevBoundary, p, c, n16);
                if (norm16HasCompBoundaryAfter(n16, onlyContiguous)) {
                    prevBoundary = prevSrc;
                } else {
                    prevBoundary = p;
                    prevNorm16 = n16;
                }
            }
        }

        if(isMaybeOrNonZeroCC(norm16)) {
            uint8_t cc=getCCFromYesOrMaybe(norm16);
            if (onlyContiguous /* FCC */ && cc != 0 &&
                    getTrailCCFromCompYesAndZeroCC(prevNorm16) > cc) {
                // The [prevBoundary..prevSrc[ character
                // passed the quick check "yes && ccc==0" test
                // but is out of canonical order with the current combining mark.
            } else {
                // If !onlyContiguous (not FCC), then we ignore the tccc of
                // the previous character which passed the quick check "yes && ccc==0" test.
                const UChar *nextSrc;
                for (;;) {
                    if (norm16 < MIN_YES_YES_WITH_CC) {
                        if (pQCResult != nullptr) {
                            *pQCResult = UNORM_MAYBE;
                        } else {
                            return prevBoundary;
                        }
                    }
                    if (src == limit) {
                        return src;
                    }
                    uint8_t prevCC = cc;
                    nextSrc = src;
                    UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, nextSrc, limit, c, norm16);
                    if (isMaybeOrNonZeroCC(norm16)) {
                        cc = getCCFromYesOrMaybe(norm16);
                        if (!(prevCC <= cc || cc == 0)) {
                            break;
                        }
                    } else {
                        break;
                    }
                    src = nextSrc;
                }
                // src is after the last in-order combining mark.
                if (isCompYesAndZeroCC(norm16)) {
                    prevBoundary = src;
                    src = nextSrc;
                    continue;
                }
            }
        }
        if(pQCResult!=NULL) {
            *pQCResult=UNORM_NO;
        }
        return prevBoundary;
    }
}